

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawLineStrip(Vector2 *points,int pointsCount,Color color)

{
  int local_20;
  int i;
  int pointsCount_local;
  Vector2 *points_local;
  Color color_local;
  
  if (1 < pointsCount) {
    rlCheckRenderBatchLimit(pointsCount);
    rlBegin(1);
    points_local._4_1_ = color.r;
    points_local._5_1_ = color.g;
    points_local._6_1_ = color.b;
    points_local._7_1_ = color.a;
    rlColor4ub(points_local._4_1_,points_local._5_1_,points_local._6_1_,points_local._7_1_);
    for (local_20 = 0; local_20 < pointsCount + -1; local_20 = local_20 + 1) {
      rlVertex2f(points[local_20].x,points[local_20].y);
      rlVertex2f(points[local_20 + 1].x,points[local_20 + 1].y);
    }
    rlEnd();
  }
  return;
}

Assistant:

void DrawLineStrip(Vector2 *points, int pointsCount, Color color)
{
    if (pointsCount >= 2)
    {
        rlCheckRenderBatchLimit(pointsCount);

        rlBegin(RL_LINES);
            rlColor4ub(color.r, color.g, color.b, color.a);

            for (int i = 0; i < pointsCount - 1; i++)
            {
                rlVertex2f(points[i].x, points[i].y);
                rlVertex2f(points[i + 1].x, points[i + 1].y);
            }
        rlEnd();
    }
}